

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  size_t sVar1;
  uint uVar2;
  char *key;
  uint uVar4;
  size_t allocsize;
  ucvector local_68;
  LodePNGInfo *local_48;
  LodePNGDecompressSettings *local_40;
  size_t local_38;
  ulong uVar3;
  
  local_68.data = (uchar *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  if (chunkLength == 0) {
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar2 = (uint)uVar3;
      if (data[uVar3] == '\0') break;
      uVar2 = uVar2 + 1;
      uVar3 = (ulong)uVar2;
    } while (uVar3 < chunkLength);
  }
  uVar4 = uVar2 + 2;
  if (uVar4 < chunkLength) {
    if (uVar2 - 0x50 < 0xffffffb1) {
      uVar2 = 0x59;
    }
    else {
      local_38 = (ulong)uVar2 + 1;
      local_48 = info;
      local_40 = zlibsettings;
      key = (char *)malloc(local_38);
      if (key != (char *)0x0) {
        key[uVar3] = '\0';
        memcpy(key,data,(ulong)uVar2);
        uVar2 = 0x48;
        if (data[local_38] == '\0') {
          uVar3 = (ulong)((int)chunkLength - uVar4);
          if (local_40->custom_zlib ==
              (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *)
              0x0) {
            uVar2 = lodepng_zlib_decompress
                              (&local_68.data,&local_68.size,data + uVar4,uVar3,local_40);
          }
          else {
            uVar2 = (*local_40->custom_zlib)
                              (&local_68.data,&local_68.size,data + uVar4,uVar3,local_40);
          }
          sVar1 = local_68.size;
          if (uVar2 == 0) {
            allocsize = local_68.size + 1;
            uVar2 = ucvector_reserve(&local_68,allocsize);
            if (uVar2 != 0) {
              local_68.data[sVar1] = '\0';
              local_68.size = allocsize;
            }
            uVar2 = lodepng_add_text(local_48,key,(char *)local_68.data);
          }
        }
        goto LAB_00111344;
      }
      uVar2 = 0x53;
    }
  }
  else {
    uVar2 = 0x4b;
  }
  key = (char *)0x0;
LAB_00111344:
  free(key);
  local_68.size = 0;
  local_68.allocsize = 0;
  free(local_68.data);
  return uVar2;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength)
{
  unsigned error = 0;
  unsigned i;

  unsigned length, string2_begin;
  char *key = 0;
  ucvector decoded;

  ucvector_init(&decoded);

  while(!error) /*not really a while loop, only used to break on error*/
  {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = chunkLength - string2_begin;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&decoded.data, &decoded.size,
                            (unsigned char*)(&data[string2_begin]),
                            length, zlibsettings);
    if(error) break;
    ucvector_push_back(&decoded, 0);

    error = lodepng_add_text(info, key, (char*)decoded.data);

    break;
  }

  lodepng_free(key);
  ucvector_cleanup(&decoded);

  return error;
}